

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O1

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
Chi2Test_abi_cxx11_(pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *__return_storage_ptr__,Float *frequencies,Float *expFrequencies,int thetaRes,
                   int phiRes,int sampleCount,Float minExpFrequency,Float significanceLevel,
                   int numTests)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  ulong uVar7;
  undefined8 uVar8;
  bool bVar9;
  undefined1 (*pauVar10) [16];
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar11;
  undefined1 (*pauVar12) [16];
  ulong uVar13;
  value_type *__val;
  Float *pFVar14;
  undefined1 (*pauVar15) [16];
  long lVar16;
  ulong uVar17;
  undefined1 (*pauVar18) [16];
  int iVar19;
  __normal_iterator<Cell_*,_std::vector<Cell,_std::allocator<Cell>_>_> __i;
  bool bVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  double dVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  int dof;
  Float pval;
  Float alpha;
  float local_98;
  int local_94;
  string local_90;
  float local_6c;
  Float local_68;
  float local_64;
  Float *local_60;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  Float local_50;
  float local_4c;
  float local_48;
  float local_44;
  ulong local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  iVar19 = thetaRes * phiRes;
  local_68 = minExpFrequency;
  if (iVar19 < 0) {
    std::__throw_length_error("cannot create std::vector larger than max_size()");
  }
  lVar16 = (long)iVar19;
  local_6c = (float)sampleCount;
  local_60 = frequencies;
  local_58 = __return_storage_ptr__;
  local_50 = significanceLevel;
  if (iVar19 == 0) {
    pauVar12 = (undefined1 (*) [16])0x0;
  }
  else {
    pauVar12 = (undefined1 (*) [16])operator_new(lVar16 << 4);
  }
  uVar17 = lVar16 * 0x10;
  pauVar15 = pauVar12;
  if (iVar19 != 0) {
    *pauVar12 = (undefined1  [16])0x0;
    if (iVar19 == 1) {
      pauVar15 = pauVar12 + 1;
    }
    else {
      pauVar15 = pauVar12 + lVar16;
      uVar13 = 0x10;
      do {
        uVar8 = *(undefined8 *)(*pauVar12 + 8);
        *(undefined8 *)(*pauVar12 + uVar13) = *(undefined8 *)*pauVar12;
        *(undefined8 *)((long)(*pauVar12 + uVar13) + 8) = uVar8;
        uVar13 = uVar13 + 0x10;
      } while (uVar17 != uVar13);
    }
  }
  lVar16 = (long)pauVar15 - (long)pauVar12 >> 4;
  if (pauVar15 != pauVar12) {
    auVar22 = vpbroadcastq_avx512f();
    auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    uVar13 = 0;
    auVar24 = vpbroadcastq_avx512f(ZEXT816(8));
    do {
      uVar7 = vpcmpuq_avx512f(auVar23,auVar22,2);
      pFVar14 = expFrequencies + uVar13;
      auVar21._4_4_ = (uint)((byte)(uVar7 >> 1) & 1) * (int)pFVar14[1];
      auVar21._0_4_ = (uint)((byte)uVar7 & 1) * (int)*pFVar14;
      auVar21._8_4_ = (uint)((byte)(uVar7 >> 2) & 1) * (int)pFVar14[2];
      auVar21._12_4_ = (uint)((byte)(uVar7 >> 3) & 1) * (int)pFVar14[3];
      auVar21._16_4_ = (uint)((byte)(uVar7 >> 4) & 1) * (int)pFVar14[4];
      auVar21._20_4_ = (uint)((byte)(uVar7 >> 5) & 1) * (int)pFVar14[5];
      auVar21._24_4_ = (uint)((byte)(uVar7 >> 6) & 1) * (int)pFVar14[6];
      auVar21._28_4_ = (uint)(byte)(uVar7 >> 7) * (int)pFVar14[7];
      auVar25 = vpsllq_avx512f(auVar23,4);
      vscatterqps_avx512f(ZEXT864(pauVar12) + ZEXT864(0) + auVar25,uVar7,auVar21);
      vpscatterqq_avx512f(ZEXT864(pauVar12) + ZEXT864(8) + auVar25,uVar7,auVar23);
      uVar13 = uVar13 + 8;
      auVar23 = vpaddq_avx512f(auVar23,auVar24);
    } while ((lVar16 + (ulong)(lVar16 == 0) + 7 & 0xfffffffffffffff8) != uVar13);
  }
  if (pauVar12 != pauVar15) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::Cell*,std::vector<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::Cell,std::allocator<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::Cell>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::__0>>
              (pauVar12,pauVar15,(int)LZCOUNT(lVar16) * 2 ^ 0x7e);
    if ((long)pauVar15 - (long)pauVar12 < 0x101) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::Cell*,std::vector<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::Cell,std::allocator<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::Cell>>>,__gnu_cxx::__ops::_Iter_comp_iter<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::__0>>
                (pauVar12,pauVar15);
    }
    else {
      pauVar18 = pauVar12 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::Cell*,std::vector<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::Cell,std::allocator<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::Cell>>>,__gnu_cxx::__ops::_Iter_comp_iter<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::__0>>
                (pauVar12,pauVar18);
      for (; pauVar18 != pauVar15; pauVar18 = pauVar18 + 1) {
        fVar28 = *(float *)*pauVar18;
        uVar6 = *(undefined4 *)(*pauVar18 + 0xc);
        uVar13 = local_90._M_string_length >> 0x20;
        local_90._M_string_length = CONCAT44((int)uVar13,uVar6);
        local_90._M_dataplus._M_p = *(pointer *)(*pauVar18 + 4);
        fVar27 = *(float *)pauVar18[-1];
        pauVar10 = pauVar18;
        while (fVar28 < fVar27) {
          uVar8 = *(undefined8 *)(pauVar10[-1] + 8);
          *(undefined8 *)*pauVar10 = *(undefined8 *)pauVar10[-1];
          *(undefined8 *)(*pauVar10 + 8) = uVar8;
          fVar27 = *(float *)pauVar10[-2];
          pauVar10 = pauVar10 + -1;
        }
        *(float *)*pauVar10 = fVar28;
        *(pointer *)(*pauVar10 + 4) = local_90._M_dataplus._M_p;
        *(undefined4 *)(*pauVar10 + 0xc) = uVar6;
      }
    }
  }
  local_94 = 0;
  bVar20 = pauVar12 == pauVar15;
  local_40 = uVar17;
  if (bVar20) {
    fVar27 = 0.0;
    local_98 = 0.0;
    fVar28 = 0.0;
  }
  else {
    fVar29 = (float)(int)local_6c * 1e-05;
    pbVar1 = &local_58->second;
    local_38 = &(local_58->second).field_2;
    fVar28 = 0.0;
    local_98 = 0.0;
    fVar27 = 0.0;
    pFVar14 = local_60;
    pauVar18 = pauVar12;
    local_4c = fVar29;
    do {
      lVar16 = *(long *)(*pauVar18 + 8);
      fVar4 = expFrequencies[lVar16];
      if ((fVar4 != 0.0) || (NAN(fVar4))) {
        if (local_68 <= fVar4) {
          fVar5 = pFVar14[lVar16];
          if ((0.0 < fVar27) && (fVar27 < local_68)) goto LAB_00268ffb;
          local_98 = local_98 + ((fVar5 - fVar4) * (fVar5 - fVar4)) / fVar4;
          local_94 = local_94 + 1;
        }
        else {
          fVar5 = pFVar14[lVar16];
LAB_00268ffb:
          fVar28 = fVar28 + fVar5;
          fVar27 = fVar27 + fVar4;
        }
        bVar9 = true;
      }
      else {
        bVar9 = true;
        if (fVar29 < pFVar14[lVar16]) {
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          local_90._M_string_length = 0;
          local_90.field_2._M_local_buf[0] = '\0';
          local_6c = fVar27;
          local_48 = fVar28;
          pbrt::detail::stringPrintfRecursive<float_const&>
                    (&local_90,
                     "Encountered %f samples in a c with expected frequency 0. Rejecting the null hypothesis!"
                     ,pFVar14 + lVar16);
          local_58->first = false;
          (local_58->second)._M_dataplus._M_p = (pointer)local_38;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)pbVar1,local_90._M_dataplus._M_p,
                     local_90._M_dataplus._M_p + local_90._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,
                            CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                     local_90.field_2._M_local_buf[0]) + 1);
          }
          bVar9 = false;
          pFVar14 = local_60;
          fVar29 = local_4c;
          fVar27 = local_6c;
          fVar28 = local_48;
        }
      }
      if (!bVar9) break;
      pauVar18 = pauVar18 + 1;
      bVar20 = pauVar18 == pauVar15;
    } while (!bVar20);
  }
  uVar17 = local_40;
  ppVar11 = local_58;
  if (bVar20) {
    if ((0.0 < fVar27) || (0.0 < fVar28)) {
      local_98 = local_98 + ((fVar28 - fVar27) * (fVar28 - fVar27)) / fVar27;
      local_94 = local_94 + 1;
    }
    iVar19 = local_94 + -1;
    if (local_94 < 2) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      local_90._M_string_length = 0;
      local_90.field_2._M_local_buf[0] = '\0';
      local_94 = iVar19;
      pbrt::detail::stringPrintfRecursive<int&>
                (&local_90,"The number of degrees of freedom %d is too low!",&local_94);
      ppVar11->first = false;
      (ppVar11->second)._M_dataplus._M_p = (pointer)&(ppVar11->second).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&ppVar11->second,local_90._M_dataplus._M_p,
                 local_90._M_dataplus._M_p + local_90._M_string_length);
    }
    else {
      local_94 = iVar19;
      dVar26 = Chi2CDF((double)local_98,iVar19);
      local_64 = 1.0 - (float)dVar26;
      local_44 = powf(1.0 - local_50,1.0 / (float)numTests);
      local_44 = 1.0 - local_44;
      paVar3 = &local_90.field_2;
      local_90._M_dataplus._M_p = (pointer)paVar3;
      if (local_44 <= local_64 && (uint)ABS(local_64) < 0x7f800000) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
        ppVar11->first = true;
        paVar2 = &(ppVar11->second).field_2;
        (ppVar11->second)._M_dataplus._M_p = (pointer)paVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p == paVar3) {
          paVar2->_M_allocated_capacity =
               CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                        local_90.field_2._M_local_buf[0]);
          *(undefined8 *)((long)&(ppVar11->second).field_2 + 8) = local_90.field_2._8_8_;
        }
        else {
          (ppVar11->second)._M_dataplus._M_p = local_90._M_dataplus._M_p;
          (ppVar11->second).field_2._M_allocated_capacity =
               CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                        local_90.field_2._M_local_buf[0]);
        }
        (ppVar11->second)._M_string_length = local_90._M_string_length;
        goto LAB_00269216;
      }
      local_90._M_string_length = 0;
      local_90.field_2._M_local_buf[0] = '\0';
      pbrt::detail::stringPrintfRecursive<float&,float&>
                (&local_90,"Rejected the null hypothesis (p-value = %f, significance level = %f",
                 &local_64,&local_44);
      ppVar11->first = false;
      (ppVar11->second)._M_dataplus._M_p = (pointer)&(ppVar11->second).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&ppVar11->second,local_90._M_dataplus._M_p,
                 local_90._M_dataplus._M_p + local_90._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
  }
LAB_00269216:
  if (pauVar12 != (undefined1 (*) [16])0x0) {
    operator_delete(pauVar12,uVar17);
  }
  return ppVar11;
}

Assistant:

std::pair<bool, std::string> Chi2Test(const Float* frequencies,
                                      const Float* expFrequencies, int thetaRes,
                                      int phiRes, int sampleCount, Float minExpFrequency,
                                      Float significanceLevel, int numTests) {
    struct Cell {
        Float expFrequency;
        size_t index;
    };

    /* Sort all cells by their expected frequencies */
    std::vector<Cell> cells(thetaRes * phiRes);
    for (size_t i = 0; i < cells.size(); ++i) {
        cells[i].expFrequency = expFrequencies[i];
        cells[i].index = i;
    }
    std::sort(cells.begin(), cells.end(), [](const Cell& a, const Cell& b) {
        return a.expFrequency < b.expFrequency;
    });

    /* Compute the Chi^2 statistic and pool cells as necessary */
    Float pooledFrequencies = 0, pooledExpFrequencies = 0, chsq = 0;
    int pooledCells = 0, dof = 0;

    for (const Cell& c : cells) {
        if (expFrequencies[c.index] == 0) {
            if (frequencies[c.index] > sampleCount * 1e-5f) {
                /* Uh oh: samples in a c that should be completely empty
                   according to the probability density function. Ordinarily,
                   even a single sample requires immediate rejection of the null
                   hypothesis. But due to finite-precision computations and
                   rounding
                   errors, this can occasionally happen without there being an
                   actual bug. Therefore, the criterion here is a bit more
                   lenient. */

                std::string result =
                    StringPrintf("Encountered %f samples in a c with expected "
                                 "frequency 0. Rejecting the null hypothesis!",
                                 frequencies[c.index]);
                return std::make_pair(false, result);
            }
        } else if (expFrequencies[c.index] < minExpFrequency) {
            /* Pool cells with low expected frequencies */
            pooledFrequencies += frequencies[c.index];
            pooledExpFrequencies += expFrequencies[c.index];
            pooledCells++;
        } else if (pooledExpFrequencies > 0 && pooledExpFrequencies < minExpFrequency) {
            /* Keep on pooling cells until a sufficiently high
               expected frequency is achieved. */
            pooledFrequencies += frequencies[c.index];
            pooledExpFrequencies += expFrequencies[c.index];
            pooledCells++;
        } else {
            Float diff = frequencies[c.index] - expFrequencies[c.index];
            chsq += (diff * diff) / expFrequencies[c.index];
            ++dof;
        }
    }

    if (pooledExpFrequencies > 0 || pooledFrequencies > 0) {
        Float diff = pooledFrequencies - pooledExpFrequencies;
        chsq += (diff * diff) / pooledExpFrequencies;
        ++dof;
    }

    /* All parameters are assumed to be known, so there is no
       additional DF reduction due to model parameters */
    dof -= 1;

    if (dof <= 0) {
        std::string result =
            StringPrintf("The number of degrees of freedom %d is too low!", dof);
        return std::make_pair(false, result);
    }

    /* Probability of obtaining a test statistic at least
       as extreme as the one observed under the assumption
       that the distributions match */
    Float pval = 1 - (Float)Chi2CDF(chsq, dof);

    /* Apply the Sidak correction term, since we'll be conducting multiple
       independent
       hypothesis tests. This accounts for the fact that the probability of a
       failure
       increases quickly when several hypothesis tests are run in sequence. */
    Float alpha = 1.0f - std::pow(1.0f - significanceLevel, 1.0f / numTests);

    if (pval < alpha || !std::isfinite(pval)) {
        std::string result = StringPrintf("Rejected the null hypothesis (p-value = %f, "
                                          "significance level = %f",
                                          pval, alpha);
        return std::make_pair(false, result);
    } else {
        return std::make_pair(true, std::string(""));
    }
}